

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

Value * DumpCTestProperty(Value *__return_storage_ptr__,string *name,Value *value)

{
  Value *pVVar1;
  Value local_88;
  Value local_50;
  undefined1 local_21;
  Value *local_20;
  Value *value_local;
  string *name_local;
  Value *property;
  
  local_21 = 0;
  local_20 = value;
  value_local = (Value *)name;
  name_local = (string *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,(string *)value_local);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_50);
  Json::Value::~Value(&local_50);
  Json::Value::Value(&local_88,value);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"value");
  Json::Value::operator=(pVVar1,&local_88);
  Json::Value::~Value(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpCTestProperty(std::string const& name,
                                     Json::Value value)
{
  Json::Value property = Json::objectValue;
  property["name"] = name;
  property["value"] = std::move(value);
  return property;
}